

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderResourceCacheVk.hpp
# Opt level: O0

void __thiscall
Diligent::ShaderResourceCacheVk::ShaderResourceCacheVk
          (ShaderResourceCacheVk *this,ResourceCacheContentType ContentType)

{
  ResourceCacheContentType RVar1;
  Char *Message;
  char (*Args_1) [32];
  undefined1 local_38 [8];
  string msg;
  ResourceCacheContentType ContentType_local;
  ShaderResourceCacheVk *this_local;
  
  msg.field_2._M_local_buf[0xf] = ContentType;
  ShaderResourceCacheBase::ShaderResourceCacheBase(&this->super_ShaderResourceCacheBase);
  std::unique_ptr<void,Diligent::STDDeleter<void,Diligent::IMemoryAllocator>>::
  unique_ptr<Diligent::STDDeleter<void,Diligent::IMemoryAllocator>,void>
            ((unique_ptr<void,Diligent::STDDeleter<void,Diligent::IMemoryAllocator>> *)
             &this->m_pMemory);
  this->m_NumSets = 0;
  this->m_NumDynamicBuffers = 0;
  *(uint *)&this->field_0x1c = *(uint *)&this->field_0x1c & 0x80000000;
  Args_1 = (char (*) [32])(ulong)((uint)(byte)msg.field_2._M_local_buf[0xf] << 0x1f);
  *(uint *)&this->field_0x1c =
       *(uint *)&this->field_0x1c & 0x7fffffff | (uint)(byte)msg.field_2._M_local_buf[0xf] << 0x1f;
  std::
  vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  ::vector(&this->m_DbgInitializedResources);
  RVar1 = GetContentType(this);
  if (RVar1 != msg.field_2._M_local_buf[0xf]) {
    FormatString<char[26],char[32]>
              ((string *)local_38,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"GetContentType() == ContentType",Args_1);
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"ShaderResourceCacheVk",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/include/ShaderResourceCacheVk.hpp"
               ,0x4f);
    std::__cxx11::string::~string((string *)local_38);
  }
  return;
}

Assistant:

explicit ShaderResourceCacheVk(ResourceCacheContentType ContentType) noexcept :
        m_TotalResources{0},
        m_ContentType{static_cast<Uint32>(ContentType)}
    {
        VERIFY_EXPR(GetContentType() == ContentType);
    }